

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O2

void __thiscall QPrintDialogPrivate::QPrintDialogPrivate(QPrintDialogPrivate *this)

{
  QAbstractPrintDialogPrivate::QAbstractPrintDialogPrivate(&this->super_QAbstractPrintDialogPrivate)
  ;
  *(undefined ***)&this->super_QAbstractPrintDialogPrivate = &PTR__QPrintDialogPrivate_001665a8;
  this->top = (QUnixPrintWidget *)0x0;
  this->bottom = (QWidget *)0x0;
  this->buttons = (QDialogButtonBox *)0x0;
  this->collapseButton = (QPushButton *)0x0;
  this->explicitDuplexMode = DuplexAuto;
  qInitResources_qprintdialog();
  return;
}

Assistant:

QPrintDialogPrivate::QPrintDialogPrivate()
    : top(nullptr), bottom(nullptr), buttons(nullptr), collapseButton(nullptr),
      explicitDuplexMode(QPrint::DuplexAuto)
{
    _q_pdu_initResources();
}